

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,short *args,unsigned_short *args_1)

{
  Printer *this_00;
  size_t sVar1;
  unsigned_short x;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_00;
  string_view format_00;
  string local_60;
  string local_40;
  
  this_00 = this->printer_;
  ToString<short,void>(&local_60,(Formatter *)(ulong)(uint)(int)*args,(short)args);
  ToString<unsigned_short,void>(&local_40,(Formatter *)(ulong)*args_1,x);
  sVar1 = strlen(format);
  args_00.len_ = 2;
  args_00.ptr_ = &local_60;
  format_00._M_str = format;
  format_00._M_len = sVar1;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,args_00,&this->vars_,format_00);
  lVar2 = -0x40;
  paVar3 = &local_40.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -4);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }